

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O0

void __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::AllocCounters<unsigned_int>
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          FunctionBody *host)

{
  Fields *pFVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  Fields **ppFVar7;
  ScriptContext *this_00;
  CriticalSection *cs;
  AutoCriticalSection local_78;
  AutoCriticalSection autoCS;
  uint8 i;
  Fields *oldFieldsArray;
  TrackAllocData local_50;
  Fields *local_28;
  Fields *fieldsArray;
  FunctionBody *pFStack_18;
  uint8 max;
  FunctionBody *host_local;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this_local;
  
  pFStack_18 = host;
  host_local = (FunctionBody *)this;
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x98,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = FunctionProxy::GetRecycler((FunctionProxy *)pFStack_18);
  if (pRVar6 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x99,"(host->GetRecycler() != nullptr)",
                                "host->GetRecycler() != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  fieldsArray._7_1_ = 0x1b;
  pRVar6 = FunctionProxy::GetRecycler((FunctionProxy *)pFStack_18);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_int::typeinfo,0,0x6c,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
             ,0x9d);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_50);
  local_28 = (Fields *)
             Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                       ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeafZero,0,0x6c);
  ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_Fields__
                      ((WriteBarrierPtr *)&(pFStack_18->counters).fields);
  pFVar1 = *ppFVar7;
  autoCS.cs._7_1_ = 0;
  if (this->fieldSize == '\x01') {
    for (; autoCS.cs._7_1_ < 0x1b; autoCS.cs._7_1_ = autoCS.cs._7_1_ + 1) {
      *(uint *)(local_28 + (ulong)autoCS.cs._7_1_ * 4) = (uint)(byte)pFVar1[autoCS.cs._7_1_];
    }
  }
  else if (this->fieldSize == '\x02') {
    for (; autoCS.cs._7_1_ < 0x1b; autoCS.cs._7_1_ = autoCS.cs._7_1_ + 1) {
      *(uint *)(local_28 + (ulong)autoCS.cs._7_1_ * 4) =
           (uint)*(ushort *)(pFVar1 + (ulong)autoCS.cs._7_1_ * 2);
    }
  }
  else if (this->fieldSize != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0xba,"(this->fieldSize==0)","this->fieldSize==0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->fieldSize == '\0') {
    this->fieldSize = '\x04';
    Memory::
    WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
    ::operator=(&this->fields,local_28);
  }
  else {
    this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_18);
    pTVar4 = ScriptContext::GetThreadContext(this_00);
    cs = ThreadContext::GetFunctionBodyLock(pTVar4);
    AutoCriticalSection::AutoCriticalSection(&local_78,cs);
    this->fieldSize = '\x04';
    Memory::
    WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
    ::operator=(&this->fields,local_28);
    AutoCriticalSection::~AutoCriticalSection(&local_78);
  }
  return;
}

Assistant:

void AllocCounters(T* host)
        {
            // only allow expanding in foreground thread. while function body cleanup 
            // we may set counters to 0 but that would not lead to expanding
            Assert(ThreadContext::GetContextForCurrentThread());
            Assert(host->GetRecycler() != nullptr);

            const uint8 max = static_cast<uint8>(CountT::Max);
            typedef CompactCounters<T, CountT> CounterT;
            CounterT::Fields* fieldsArray = (CounterT::Fields*)RecyclerNewArrayLeafZ(host->GetRecycler(), FieldT, sizeof(FieldT)*max);
            CounterT::Fields* oldFieldsArray = host->counters.fields;
            uint8 i = 0;
            if (this->fieldSize == 1)
            {
                if (sizeof(FieldT) == 2)
                {
                    for (; i < max; i++)
                    {
                        fieldsArray->u16Fields[i] = oldFieldsArray->u8Fields[i];
                    }
                }
                else if (sizeof(FieldT) == 4)
                {
                    for (; i < max; i++)
                    {
                        fieldsArray->u32Fields[i] = oldFieldsArray->u8Fields[i];
                    }
                }
            }
            else if (this->fieldSize == 2)
            {
                for (; i < max; i++)
                {
                    fieldsArray->u32Fields[i] = oldFieldsArray->u16Fields[i];
                }
            }
            else
            {
                Assert(this->fieldSize==0);
            }

            if (this->fieldSize == 0)
            {
                this->fieldSize = sizeof(FieldT);
                this->fields = fieldsArray;
            }
            else
            {
                AutoCriticalSection autoCS(host->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
                this->fieldSize = sizeof(FieldT);
                this->fields = fieldsArray;
            }
        }